

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Qbf_Man_t * Gia_QbfAlloc(Gia_Man_t *pGia,int nPars,int fGlucose,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Cnf_Dat_t *p;
  Qbf_Man_t *pQVar3;
  abctime aVar4;
  sat_solver *psVar5;
  bmcg_sat_solver *s;
  Vec_Int_t *pVVar6;
  
  s = (bmcg_sat_solver *)0x0;
  pGVar2 = Gia_ManPo(pGia,0);
  Gia_ObjFlipFaninC0(pGVar2);
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  pGVar2 = Gia_ManPo(pGia,0);
  Gia_ObjFlipFaninC0(pGVar2);
  pQVar3 = (Qbf_Man_t *)calloc(1,0x58);
  aVar4 = Abc_Clock();
  pQVar3->clkStart = aVar4;
  pQVar3->pGia = pGia;
  pQVar3->nPars = nPars;
  iVar1 = pGia->vCis->nSize - pGia->nRegs;
  pQVar3->nVars = iVar1 - nPars;
  pQVar3->fVerbose = fVerbose;
  pQVar3->iParVarBeg = p->nVars - iVar1;
  psVar5 = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  pQVar3->pSatVer = psVar5;
  psVar5 = sat_solver_new();
  pQVar3->pSatSyn = psVar5;
  if (fGlucose != 0) {
    s = bmcg_sat_solver_start();
  }
  pQVar3->pSatSynG = s;
  pVVar6 = Vec_IntAlloc(pGia->vCis->nSize - pGia->nRegs);
  pQVar3->vValues = pVVar6;
  pVVar6 = Vec_IntAlloc(nPars);
  pVVar6->nSize = nPars;
  if (pVVar6->pArray != (int *)0x0) {
    memset(pVVar6->pArray,0xff,(long)nPars << 2);
  }
  pQVar3->vParMap = pVVar6;
  pVVar6 = Vec_IntAlloc(nPars);
  pQVar3->vLits = pVVar6;
  sat_solver_setnvars(psVar5,nPars);
  if (s != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_set_nvars(s,nPars);
  }
  Cnf_DataFree(p);
  return pQVar3;
}

Assistant:

Qbf_Man_t * Gia_QbfAlloc( Gia_Man_t * pGia, int nPars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p;
    Cnf_Dat_t * pCnf;
    Gia_ObjFlipFaninC0( Gia_ManPo(pGia, 0) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    Gia_ObjFlipFaninC0( Gia_ManPo(pGia, 0) );
    p = ABC_CALLOC( Qbf_Man_t, 1 );
    p->clkStart   = Abc_Clock();
    p->pGia       = pGia;
    p->nPars      = nPars;
    p->nVars      = Gia_ManPiNum(pGia) - nPars;
    p->fVerbose   = fVerbose;
    p->iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    p->pSatVer    = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    p->pSatSyn    = sat_solver_new();
    p->pSatSynG   = fGlucose ? bmcg_sat_solver_start() : NULL; 
    p->vValues    = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    p->vParMap    = Vec_IntStartFull( nPars );
    p->vLits      = Vec_IntAlloc( nPars );
    sat_solver_setnvars( p->pSatSyn, nPars );
    if ( p->pSatSynG ) bmcg_sat_solver_set_nvars( p->pSatSynG, nPars );
    Cnf_DataFree( pCnf );
    return p;
}